

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sprite.cpp
# Opt level: O2

void __thiscall sf::Sprite::setTexture(Sprite *this,Texture *texture,bool resetRect)

{
  bool bVar1;
  Vector2u VVar2;
  Vector2u VVar3;
  undefined3 in_register_00000011;
  Rect<int> local_28;
  
  if (CONCAT31(in_register_00000011,resetRect) == 0) {
    if (this->m_texture != (Texture *)0x0) goto LAB_001392a3;
    local_28.left = 0;
    local_28.top = 0;
    local_28.width = 0;
    local_28.height = 0;
    bVar1 = operator==(&this->m_textureRect,&local_28);
    if (!bVar1) goto LAB_001392a3;
  }
  VVar2 = Texture::getSize(texture);
  VVar3 = Texture::getSize(texture);
  local_28.left = 0;
  local_28.top = 0;
  local_28.height = VVar3.y;
  local_28.width = VVar2.x;
  setTextureRect(this,&local_28);
LAB_001392a3:
  this->m_texture = texture;
  return;
}

Assistant:

void Sprite::setTexture(const Texture& texture, bool resetRect)
{
    // Recompute the texture area if requested, or if there was no valid texture & rect before
    if (resetRect || (!m_texture && (m_textureRect == sf::IntRect())))
        setTextureRect(IntRect(0, 0, texture.getSize().x, texture.getSize().y));

    // Assign the new texture
    m_texture = &texture;
}